

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_common.c
# Opt level: O0

void * ZSTD_calloc(size_t size,ZSTD_customMem customMem)

{
  size_t in_RDI;
  code *in_stack_00000008;
  void *ptr;
  undefined8 local_8;
  
  if (in_stack_00000008 == (code *)0x0) {
    local_8 = calloc(1,in_RDI);
  }
  else {
    local_8 = (void *)(*in_stack_00000008)(size);
    memset(local_8,0,in_RDI);
  }
  return local_8;
}

Assistant:

void* ZSTD_calloc(size_t size, ZSTD_customMem customMem)
{
    if (customMem.customAlloc) {
        /* calloc implemented as malloc+memset;
         * not as efficient as calloc, but next best guess for custom malloc */
        void* const ptr = customMem.customAlloc(customMem.opaque, size);
        memset(ptr, 0, size);
        return ptr;
    }
    return calloc(1, size);
}